

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O0

void __thiscall
icu_63::CollationKey::CollationKey(CollationKey *this,uint8_t *newValues,int32_t count)

{
  int32_t iVar1;
  uint8_t *puVar2;
  int32_t count_local;
  uint8_t *newValues_local;
  CollationKey *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationKey_004ed638;
  this->fFlagAndLength = count;
  this->fHashCode = 0;
  if ((count < 0) || ((newValues == (uint8_t *)0x0 && (count != 0)))) {
LAB_0028687e:
    setToBogus(this);
  }
  else {
    iVar1 = getCapacity(this);
    if (iVar1 < count) {
      puVar2 = reallocate(this,count,0);
      if (puVar2 == (uint8_t *)0x0) goto LAB_0028687e;
    }
    if (0 < count) {
      puVar2 = getBytes(this);
      memcpy(puVar2,newValues,(long)count);
    }
  }
  return;
}

Assistant:

CollationKey::CollationKey(const uint8_t* newValues, int32_t count)
    : UObject(), fFlagAndLength(count),
      fHashCode(kInvalidHashCode)
{
    if (count < 0 || (newValues == NULL && count != 0) ||
            (count > getCapacity() && reallocate(count, 0) == NULL)) {
        setToBogus();
        return;
    }

    if (count > 0) {
        uprv_memcpy(getBytes(), newValues, count);
    }
}